

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_diag_mask_zero_impl(ggml_context *ctx,ggml_tensor *a,int n_past,_Bool inplace)

{
  ggml_tensor *tensor;
  byte in_CL;
  ggml_tensor *in_RSI;
  int32_t params [1];
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ggml_context *in_stack_ffffffffffffffe0;
  
  if ((in_CL & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    tensor = ggml_view_tensor(in_stack_ffffffffffffffe0,
                              (ggml_tensor *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  ggml_set_op_params(tensor,in_stack_ffffffffffffffc8,0x14ec71);
  tensor->op = GGML_OP_DIAG_MASK_ZERO;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_diag_mask_zero_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[] = { n_past };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_DIAG_MASK_ZERO;
    result->src[0] = a;

    return result;
}